

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

Vec_Int_t * Ga2_ManRefine(Ga2_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  Vec_Int_t *pVVar7;
  Abc_Cex_t *pAVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  Vec_Int_t *vMap;
  Abc_Cex_t *pCex;
  Vec_Int_t *local_30;
  Abc_Cex_t *local_28;
  
  if (p->pPars->fAddLayer == 0) {
    Ga2_GlaPrepareCexAndMap(p,&local_28,&local_30);
    p_00 = Rnm_ManRefine(p->pRnm,local_28,local_30,p->pPars->fPropFanout,p->pPars->fNewRefine,1);
    Abc_CexFree(local_28);
    if (p_00->nSize == 0) {
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
      }
      free(p_00);
      Abc_CexFreeP(&p->pGia->pCexSeq);
      pAVar8 = Ga2_ManDeriveCex(p,local_30);
      p->pGia->pCexSeq = pAVar8;
      if (local_30->pArray != (int *)0x0) {
        free(local_30->pArray);
      }
      free(local_30);
      return (Vec_Int_t *)0x0;
    }
    if (local_30->pArray != (int *)0x0) {
      free(local_30->pArray);
    }
    free(local_30);
    uVar9 = p_00->nSize;
    if (0 < (int)uVar9) {
      pGVar3 = p->pGia;
      piVar6 = p_00->pArray;
      lVar12 = 0;
      uVar5 = 0;
      do {
        iVar1 = piVar6[lVar12];
        if (((long)iVar1 < 0) || (pGVar3->nObjs <= iVar1)) goto LAB_00583bce;
        if (pGVar3->pObjs == (Gia_Obj_t *)0x0) break;
        if (p->vIds->nSize <= iVar1) goto LAB_00583bed;
        uVar2 = p->vIds->pArray[iVar1];
        if ((int)uVar2 < 0) {
LAB_00583ada:
          if (((int)uVar5 < 0) || (uVar9 <= uVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          uVar11 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
          piVar6[uVar11] = iVar1;
          uVar9 = p_00->nSize;
        }
        else {
          if (p->vCnfs->nSize <= (int)(uVar2 * 2)) goto LAB_00583c0c;
          if (p->vCnfs->pArray[(ulong)uVar2 * 2] == (void *)0x0) goto LAB_00583ada;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < (int)uVar9);
      if ((int)uVar5 <= (int)uVar9) {
        p_00->nSize = uVar5;
        if (0 < (int)uVar5) {
          uVar11 = 0;
          do {
            iVar1 = p_00->pArray[uVar11];
            if (((long)iVar1 < 0) || (p->pGia->nObjs <= iVar1)) goto LAB_00583bce;
            pGVar4 = p->pGia->pObjs;
            if (pGVar4 == (Gia_Obj_t *)0x0) break;
            if (-1 < *(long *)(pGVar4 + iVar1)) {
              __assert_fail("pObj->fPhase",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                            ,0x530,"Vec_Int_t *Ga2_ManRefine(Ga2_Man_t *)");
            }
            uVar11 = uVar11 + 1;
          } while (uVar5 != uVar11);
        }
        goto LAB_00583bbc;
      }
LAB_00583ccc:
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    if ((int)uVar9 < 0) goto LAB_00583ccc;
    p_00->nSize = 0;
  }
  else {
    p_00 = (Vec_Int_t *)malloc(0x10);
    p_00->nCap = 100;
    p_00->nSize = 0;
    piVar6 = (int *)malloc(400);
    p_00->pArray = piVar6;
    pVVar7 = p->vValues;
    if (0 < pVVar7->nSize) {
      lVar12 = 0;
      do {
        iVar1 = pVVar7->pArray[lVar12];
        lVar10 = (long)iVar1;
        if ((lVar10 < 0) || (pGVar3 = p->pGia, pGVar3->nObjs <= iVar1)) {
LAB_00583bce:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pGVar3->pObjs == (Gia_Obj_t *)0x0) break;
        if (lVar12 != 0) {
          if (p->vIds->nSize <= iVar1) {
LAB_00583bed:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pGVar4 = pGVar3->pObjs + lVar10;
          uVar9 = p->vIds->pArray[lVar10];
          if ((int)uVar9 < 0) {
            if (*(long *)pGVar4 < 0) {
              __assert_fail("Ga2_ObjIsLeaf(p, pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                            ,0x510,"Vec_Int_t *Ga2_ManRefine(Ga2_Man_t *)");
            }
LAB_00583c31:
            __assert_fail("pObj->fPhase",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                          ,0x50f,"Vec_Int_t *Ga2_ManRefine(Ga2_Man_t *)");
          }
          if (p->vCnfs->nSize <= (int)(uVar9 * 2)) {
LAB_00583c0c:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if (p->vCnfs->pArray[(ulong)uVar9 * 2] == (void *)0x0) {
            lVar10 = *(long *)pGVar4;
            if (-1 < lVar10) goto LAB_00583c31;
            uVar9 = (uint)lVar10;
            if (((uVar9 & 0x9fffffff) != 0x9fffffff) &&
               ((int)uVar9 < 0 || (~uVar9 & 0x1fffffff) == 0)) {
              __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                            ,0x511,"Vec_Int_t *Ga2_ManRefine(Ga2_Man_t *)");
            }
            if (((uVar9 & 0x9fffffff) != 0x9fffffff) ||
               (pGVar3->vCis->nSize - pGVar3->nRegs <=
                (int)((uint)((ulong)lVar10 >> 0x20) & 0x1fffffff))) {
              Vec_IntPush(p_00,iVar1);
              pVVar7 = p->vValues;
            }
          }
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < pVVar7->nSize);
      uVar5 = p_00->nSize;
      goto LAB_00583bbc;
    }
  }
  uVar5 = 0;
LAB_00583bbc:
  p->nObjAdded = p->nObjAdded + uVar5;
  return p_00;
}

Assistant:

Vec_Int_t * Ga2_ManRefine( Ga2_Man_t * p )
{
    Abc_Cex_t * pCex;
    Vec_Int_t * vMap, * vVec;
    Gia_Obj_t * pObj;
    int i, k;
    if ( p->pPars->fAddLayer )
    {
        // use simplified refinement strategy, which adds logic near at PPI without finding important ones
        vVec = Vec_IntAlloc( 100 );
        Gia_ManForEachObjVec( p->vValues, p->pGia, pObj, i )
        {
            if ( !i ) continue;
            if ( Ga2_ObjIsAbs(p, pObj) )
                continue;
            assert( pObj->fPhase );
            assert( Ga2_ObjIsLeaf(p, pObj) );
            assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj) );
            if ( Gia_ObjIsPi(p->pGia, pObj) )
                continue;
            Vec_IntPush( vVec, Gia_ObjId(p->pGia, pObj) );
        }
        p->nObjAdded += Vec_IntSize(vVec);
        return vVec;
    }
    Ga2_GlaPrepareCexAndMap( p, &pCex, &vMap );
 //    Rf2_ManRefine( p->pRf2, pCex, vMap, p->pPars->fPropFanout, 1 );
    vVec = Rnm_ManRefine( p->pRnm, pCex, vMap, p->pPars->fPropFanout, p->pPars->fNewRefine, 1 );
//    printf( "Refinement %d\n", Vec_IntSize(vVec) );
    Abc_CexFree( pCex );
    if ( Vec_IntSize(vVec) == 0 )
    {
        Vec_IntFree( vVec );
        Abc_CexFreeP( &p->pGia->pCexSeq );
        p->pGia->pCexSeq = Ga2_ManDeriveCex( p, vMap );
        Vec_IntFree( vMap );
        return NULL;
    }
    Vec_IntFree( vMap );
    // remove those already added
    k = 0;
    Gia_ManForEachObjVec( vVec, p->pGia, pObj, i )
        if ( !Ga2_ObjIsAbs(p, pObj) )
            Vec_IntWriteEntry( vVec, k++, Gia_ObjId(p->pGia, pObj) );
    Vec_IntShrink( vVec, k );

    // these objects should be PPIs that are not abstracted yet
    Gia_ManForEachObjVec( vVec, p->pGia, pObj, i )
        assert( pObj->fPhase );//&& Ga2_ObjIsLeaf(p, pObj) );
    p->nObjAdded += Vec_IntSize(vVec);
    return vVec;
}